

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdParseDescriptor(void *handle,char *descriptor,int network_type,char *bip32_derivation_path,
                      void **descriptor_handle,uint32_t *max_index)

{
  NetType type;
  void *pvVar1;
  undefined8 *puVar2;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *this;
  CfdException *pCVar3;
  allocator local_74a;
  bool is_bitcoin;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> script_list;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> multisig_key_list;
  string local_708;
  AddressFactory factory;
  string derive_path;
  DescriptorScriptData desc_data;
  DescriptorScriptData local_368;
  
  cfd::Initialize();
  if (descriptor_handle == (void **)0x0) {
    desc_data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
         + 0x56;
    desc_data.locking_script._vptr_Script._0_4_ = 0x1a0;
    desc_data.locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdParseDescriptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)&desc_data,"descriptor handle is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&desc_data,"Failed to parameter. descriptor handle is null.",
               (allocator *)&local_368);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&desc_data);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (descriptor != (char *)0x0) {
    is_bitcoin = false;
    type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    derive_path._M_dataplus._M_p = (pointer)&derive_path.field_2;
    derive_path._M_string_length = 0;
    derive_path.field_2._M_local_buf[0] = '\0';
    if ((bip32_derivation_path != (char *)0x0) && (*bip32_derivation_path != '\0')) {
      std::__cxx11::string::string
                ((string *)&desc_data,bip32_derivation_path,(allocator *)&local_368);
      std::__cxx11::string::operator=((string *)&derive_path,(string *)&desc_data);
      std::__cxx11::string::~string((string *)&desc_data);
    }
    script_list.
    super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    script_list.
    super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    script_list.
    super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    multisig_key_list.
    super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    multisig_key_list.
    super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    multisig_key_list.
    super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::DescriptorScriptData::DescriptorScriptData(&desc_data);
    if (is_bitcoin == true) {
      cfd::AddressFactory::AddressFactory(&factory,type);
      std::__cxx11::string::string((string *)&local_708,descriptor,&local_74a);
      cfd::AddressFactory::ParseOutputDescriptor
                (&local_368,&factory,&local_708,&derive_path,&script_list,&multisig_key_list,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
      cfd::DescriptorScriptData::operator=(&desc_data,&local_368);
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&factory,type);
      std::__cxx11::string::string((string *)&local_708,descriptor,&local_74a);
      cfd::AddressFactory::ParseOutputDescriptor
                (&local_368,&factory,&local_708,&derive_path,&script_list,&multisig_key_list,
                 (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
      cfd::DescriptorScriptData::operator=(&desc_data,&local_368);
    }
    cfd::DescriptorScriptData::~DescriptorScriptData(&local_368);
    std::__cxx11::string::~string((string *)&local_708);
    cfd::AddressFactory::~AddressFactory(&factory);
    if (script_list.
        super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        script_list.
        super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::push_back
                (&script_list,&desc_data);
    }
    std::__cxx11::string::string((string *)&local_368,"Descriptor",(allocator *)&factory);
    pvVar1 = cfd::capi::AllocBuffer((string *)&local_368,0x28);
    std::__cxx11::string::~string((string *)&local_368);
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar2;
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x20) = puVar2;
    this = (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
           operator_new(0x18);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::vector
              (this,1,(allocator_type *)&local_368);
    *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
     ((long)pvVar1 + 0x10) = this;
    std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<cfd::DescriptorScriptData*,std::vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>>>>
              (*(vector<cfd::DescriptorScriptData,std::allocator<cfd::DescriptorScriptData>> **)
                ((long)pvVar1 + 0x18),
               script_list.
               super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
               ._M_impl.super__Vector_impl_data._M_start,
               script_list.
               super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<cfd::DescriptorKeyData*,std::vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>>>>
              (*(vector<cfd::DescriptorKeyData,std::allocator<cfd::DescriptorKeyData>> **)
                ((long)pvVar1 + 0x20),
               multisig_key_list.
               super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
               _M_impl.super__Vector_impl_data._M_start,
               multisig_key_list.
               super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    cfd::DescriptorScriptData::operator=
              ((DescriptorScriptData *)**(undefined8 **)((long)pvVar1 + 0x10),&desc_data);
    if (max_index != (uint32_t *)0x0) {
      *max_index = (int)(((long)script_list.
                                super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)script_list.
                               super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x338) - 1;
    }
    *descriptor_handle = pvVar1;
    cfd::DescriptorScriptData::~DescriptorScriptData(&desc_data);
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::~vector
              (&multisig_key_list);
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::~vector
              (&script_list);
    std::__cxx11::string::~string((string *)&derive_path);
    return 0;
  }
  desc_data._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
       + 0x56;
  desc_data.locking_script._vptr_Script._0_4_ = 0x1a6;
  desc_data.locking_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdParseDescriptor";
  cfd::core::logger::warn<>((CfdSourceLocation *)&desc_data,"descriptor is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&desc_data,"Failed to parameter. descriptor is null.",(allocator *)&local_368
            );
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&desc_data);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdParseDescriptor(
    void* handle, const char* descriptor, int network_type,
    const char* bip32_derivation_path, void** descriptor_handle,
    uint32_t* max_index) {
  CfdCapiOutputDescriptor* buffer = nullptr;
  try {
    cfd::Initialize();
    if (descriptor_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor handle is null.");
    }
    if (descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    std::string derive_path;
    if ((bip32_derivation_path != nullptr) &&
        (*bip32_derivation_path != '\0')) {
      derive_path = std::string(bip32_derivation_path);
    }

    std::vector<DescriptorScriptData> script_list;
    std::vector<DescriptorKeyData> multisig_key_list;
    DescriptorScriptData desc_data;
    if (is_bitcoin) {
      AddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      desc_data = factory.ParseOutputDescriptor(
          descriptor, derive_path, &script_list, &multisig_key_list);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (script_list.empty()) {
      script_list.push_back(desc_data);
    }

    buffer = static_cast<CfdCapiOutputDescriptor*>(
        AllocBuffer(kPrefixOutputDescriptor, sizeof(CfdCapiOutputDescriptor)));
    buffer->script_list = new std::vector<DescriptorScriptData>();
    buffer->multisig_key_list = new std::vector<DescriptorKeyData>();
    buffer->script_root = new std::vector<DescriptorScriptData>(1);
    buffer->script_list->assign(script_list.begin(), script_list.end());
    // *(buffer->script_list) = script_list;
    buffer->multisig_key_list->assign(
        multisig_key_list.begin(), multisig_key_list.end());
    // *(buffer->multisig_key_list) = multisig_key_list;
    (*buffer->script_root)[0] = desc_data;
    if (max_index != nullptr) {
      *max_index = static_cast<uint32_t>(script_list.size() - 1);
    }
    *descriptor_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    if (buffer != nullptr) CfdFreeDescriptorHandle(handle, buffer);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}